

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,char *macroName,SourceLineInfo *lineInfo,char *capturedExpression,
          Flags resultDisposition)

{
  char *pcVar1;
  char *_lineInfo;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  Flags local_2c;
  char *pcStack_28;
  Flags resultDisposition_local;
  char *capturedExpression_local;
  SourceLineInfo *lineInfo_local;
  char *macroName_local;
  ResultBuilder *this_local;
  
  local_2c = resultDisposition;
  pcStack_28 = capturedExpression;
  capturedExpression_local = (char *)lineInfo;
  lineInfo_local = (SourceLineInfo *)macroName;
  macroName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,macroName,&local_51);
  _lineInfo = capturedExpression_local;
  pcVar1 = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,&local_89);
  AssertionInfo::AssertionInfo
            (&this->m_assertionInfo,(string *)local_50,(SourceLineInfo *)_lineInfo,
             (string *)local_88,local_2c);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  AssertionResultData::AssertionResultData(&this->m_data);
  ExprComponents::ExprComponents(&this->m_exprComponents);
  CopyableStream::CopyableStream(&this->m_stream);
  this->m_shouldDebugBreak = false;
  this->m_shouldThrow = false;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(   char const* macroName,
                                    SourceLineInfo const& lineInfo,
                                    char const* capturedExpression,
                                    ResultDisposition::Flags resultDisposition )
    :   m_assertionInfo( macroName, lineInfo, capturedExpression, resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}